

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O1

unsigned_long_long XXH64_digest(XXH64_state_t *state_in)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint *puVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  
  uVar1 = (uint)state_in->ll[6];
  if ((ulong)state_in->ll[0] < 0x20) {
    lVar4 = state_in->ll[1] + 0x27d4eb2f165667c5;
  }
  else {
    lVar4 = state_in->ll[2];
    uVar5 = state_in->ll[3];
    uVar2 = state_in->ll[4];
    uVar3 = state_in->ll[5];
    lVar4 = ((uVar3 * -0x3d4d51c2d82b14b1 >> 0x21 | uVar3 * -0x6c158a5880000000) *
             -0x61c8864e7a143579 ^
            ((uVar2 * -0x3d4d51c2d82b14b1 >> 0x21 | uVar2 * -0x6c158a5880000000) *
             -0x61c8864e7a143579 ^
            ((uVar5 * -0x3d4d51c2d82b14b1 >> 0x21 | uVar5 * -0x6c158a5880000000) *
             -0x61c8864e7a143579 ^
            (((ulong)(lVar4 * -0x3d4d51c2d82b14b1) >> 0x21 | lVar4 * -0x6c158a5880000000) *
             -0x61c8864e7a143579 ^
            (uVar3 << 0x12 | uVar3 >> 0x2e) + (uVar2 << 0xc | uVar2 >> 0x34) +
            (uVar5 << 7 | uVar5 >> 0x39) + (lVar4 << 1 | (ulong)(lVar4 < 0))) * -0x61c8864e7a143579
            + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579
            + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + -0x7a1435883d4d519d;
  }
  puVar8 = (uint *)((long)state_in->ll + (ulong)uVar1 + 0x34);
  puVar9 = (uint *)((long)state_in->ll + 0x34);
  uVar5 = lVar4 + state_in->ll[0];
  puVar6 = puVar9;
  if (7 < uVar1) {
    do {
      uVar5 = ((ulong)(*(long *)puVar6 * -0x3d4d51c2d82b14b1) >> 0x21 |
              *(long *)puVar6 * -0x6c158a5880000000) * -0x61c8864e7a143579 ^ uVar5;
      uVar5 = (uVar5 << 0x1b | uVar5 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
      puVar9 = puVar6 + 2;
      puVar7 = puVar6 + 4;
      puVar6 = puVar9;
    } while (puVar7 <= puVar8);
  }
  if (puVar9 + 1 <= puVar8) {
    uVar5 = (ulong)*puVar9 * -0x61c8864e7a143579 ^ uVar5;
    uVar5 = (uVar5 << 0x17 | uVar5 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    puVar9 = puVar9 + 1;
  }
  for (; puVar9 < puVar8; puVar9 = (uint *)((long)puVar9 + 1)) {
    uVar5 = (ulong)(byte)*puVar9 * 0x27d4eb2f165667c5 ^ uVar5;
    uVar5 = (uVar5 << 0xb | uVar5 >> 0x35) * -0x61c8864e7a143579;
  }
  uVar5 = (uVar5 >> 0x21 ^ uVar5) * -0x3d4d51c2d82b14b1;
  uVar5 = (uVar5 >> 0x1d ^ uVar5) * 0x165667b19e3779f9;
  return uVar5 >> 0x20 ^ uVar5;
}

Assistant:

unsigned long long XXH64_digest(const XXH64_state_t *state_in) {
    XXH_endianess endian_detected = (XXH_endianess) XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected == XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_digest_endian(state_in, XXH_littleEndian);
    else
        return XXH64_digest_endian(state_in, XXH_bigEndian);
}